

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_cf_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  void *pvVar1;
  _Bool _Var2;
  CURLcode local_4c;
  curltime *when;
  ssl_connect_data *connssl;
  void *pres2_local;
  int *pres1_local;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if (query == 5) {
    if ((cf->field_0x24 & 1) != 0) {
      _Var2 = Curl_ssl_cf_is_proxy(cf);
      if (!_Var2) {
        *(undefined8 *)pres2 = *(undefined8 *)((long)pvVar1 + 0x40);
        *(undefined8 *)((long)pres2 + 8) = *(undefined8 *)((long)pvVar1 + 0x48);
      }
    }
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    if (cf->next == (Curl_cfilter *)0x0) {
      local_4c = CURLE_UNKNOWN_OPTION;
    }
    else {
      local_4c = (*cf->next->cft->query)(cf->next,data,query,pres1,pres2);
    }
    cf_local._4_4_ = local_4c;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode ssl_cf_query(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             int query, int *pres1, void *pres2)
{
  struct ssl_connect_data *connssl = cf->ctx;

  switch(query) {
  case CF_QUERY_TIMER_APPCONNECT: {
    struct curltime *when = pres2;
    if(cf->connected && !Curl_ssl_cf_is_proxy(cf))
      *when = connssl->handshake_done;
    return CURLE_OK;
  }
  default:
    break;
  }
  return cf->next ?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}